

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O3

CURLcode Curl_hsts_parse(hsts *h,char *hostname,char *header)

{
  byte *pbVar1;
  char *hostname_00;
  hsts *h_00;
  _Bool _Var2;
  byte bVar3;
  int iVar4;
  CURLofft CVar5;
  uint c;
  CURLcode CVar6;
  time_t tVar7;
  stsentry *psVar8;
  ulong uVar9;
  long lVar10;
  bool subdomains;
  byte *pbVar11;
  bool bVar12;
  curl_off_t expires;
  char *endp;
  curl_off_t local_58;
  time_t local_50;
  char *local_48;
  hsts *local_40;
  byte *local_38;
  
  local_58 = 0;
  CVar6 = CURLE_OK;
  tVar7 = time((time_t *)0x0);
  _Var2 = Curl_host_is_ipnum(hostname);
  if (!_Var2) {
    bVar3 = *header;
    bVar12 = false;
    subdomains = false;
    local_50 = tVar7;
    local_48 = hostname;
    local_40 = h;
    do {
      while ((bVar3 != 0 && (iVar4 = Curl_isspace((uint)bVar3), iVar4 != 0))) {
        bVar3 = ((byte *)header)[1];
        header = (char *)((byte *)header + 1);
      }
      iVar4 = Curl_strncasecompare("max-age=",header,8);
      if (iVar4 == 0) {
        iVar4 = Curl_strncasecompare("includesubdomains",header,0x11);
        if (iVar4 != 0) {
          if (subdomains) {
            return CURLE_BAD_FUNCTION_ARGUMENT;
          }
          header = (char *)((byte *)header + 0x11);
          subdomains = true;
          goto LAB_0012157e;
        }
        while( true ) {
          bVar3 = *header;
          c = (uint)bVar3;
          if ((bVar3 == 0) || (bVar3 == 0x3b)) break;
          header = (char *)((byte *)header + 1);
        }
      }
      else {
        if (bVar12) {
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
        pbVar11 = (byte *)header + 8;
        bVar3 = ((byte *)header)[8];
        while (bVar3 != 0) {
          iVar4 = Curl_isspace((uint)bVar3);
          if (iVar4 == 0) {
            bVar12 = *pbVar11 == 0x22;
            goto LAB_00121531;
          }
          pbVar1 = pbVar11 + 1;
          pbVar11 = pbVar11 + 1;
          bVar3 = *pbVar1;
        }
        bVar12 = false;
LAB_00121531:
        CVar5 = curlx_strtoofft((char *)(pbVar11 + bVar12),(char **)&local_38,10,&local_58);
        if (CVar5 != CURL_OFFT_OK) {
          if (CVar5 != CURL_OFFT_FLOW) {
            return CURLE_BAD_FUNCTION_ARGUMENT;
          }
          local_58 = 0x7fffffffffffffff;
        }
        header = (char *)local_38;
        if (bVar12 != false) {
          if (*local_38 != 0x22) {
            return CURLE_BAD_FUNCTION_ARGUMENT;
          }
          header = (char *)(local_38 + 1);
        }
        bVar12 = true;
LAB_0012157e:
        c = (uint)(byte)*header;
      }
      while ((char)c != '\0') {
        iVar4 = Curl_isspace(c);
        if (iVar4 == 0) {
          uVar9 = (ulong)(*header == 0x3b);
          goto LAB_001215aa;
        }
        pbVar11 = (byte *)header + 1;
        header = (char *)((byte *)header + 1);
        c = (uint)*pbVar11;
      }
      uVar9 = 0;
LAB_001215aa:
      h_00 = local_40;
      hostname_00 = local_48;
      bVar3 = ((byte *)header)[uVar9];
      header = (char *)((byte *)header + uVar9);
    } while (bVar3 != 0);
    CVar6 = CURLE_BAD_FUNCTION_ARGUMENT;
    if (bVar12) {
      if (local_58 == 0) {
        CVar6 = CURLE_OK;
        psVar8 = Curl_hsts(local_40,local_48,false);
        if (psVar8 != (stsentry *)0x0) {
          CVar6 = CURLE_OK;
          Curl_llist_remove(&h_00->list,&psVar8->node,(void *)0x0);
          (*Curl_cfree)(psVar8->host);
          (*Curl_cfree)(psVar8);
        }
      }
      else {
        lVar10 = local_50 + local_58;
        if (0x7fffffffffffffff - local_50 < local_58) {
          lVar10 = 0x7fffffffffffffff;
        }
        CVar6 = CURLE_OK;
        local_58 = lVar10;
        psVar8 = Curl_hsts(local_40,local_48,false);
        if (psVar8 == (stsentry *)0x0) {
          CVar6 = hsts_create(h_00,hostname_00,subdomains,local_58);
        }
        else {
          psVar8->expires = local_58;
          psVar8->includeSubDomains = subdomains;
        }
      }
    }
  }
  return CVar6;
}

Assistant:

CURLcode Curl_hsts_parse(struct hsts *h, const char *hostname,
                         const char *header)
{
  const char *p = header;
  curl_off_t expires = 0;
  bool gotma = FALSE;
  bool gotinc = FALSE;
  bool subdomains = FALSE;
  struct stsentry *sts;
  time_t now = time(NULL);

  if(Curl_host_is_ipnum(hostname))
    /* "explicit IP address identification of all forms is excluded."
       / RFC 6797 */
    return CURLE_OK;

  do {
    while(*p && ISSPACE(*p))
      p++;
    if(Curl_strncasecompare("max-age=", p, 8)) {
      bool quoted = FALSE;
      CURLofft offt;
      char *endp;

      if(gotma)
        return CURLE_BAD_FUNCTION_ARGUMENT;

      p += 8;
      while(*p && ISSPACE(*p))
        p++;
      if(*p == '\"') {
        p++;
        quoted = TRUE;
      }
      offt = curlx_strtoofft(p, &endp, 10, &expires);
      if(offt == CURL_OFFT_FLOW)
        expires = CURL_OFF_T_MAX;
      else if(offt)
        /* invalid max-age */
        return CURLE_BAD_FUNCTION_ARGUMENT;
      p = endp;
      if(quoted) {
        if(*p != '\"')
          return CURLE_BAD_FUNCTION_ARGUMENT;
        p++;
      }
      gotma = TRUE;
    }
    else if(Curl_strncasecompare("includesubdomains", p, 17)) {
      if(gotinc)
        return CURLE_BAD_FUNCTION_ARGUMENT;
      subdomains = TRUE;
      p += 17;
      gotinc = TRUE;
    }
    else {
      /* unknown directive, do a lame attempt to skip */
      while(*p && (*p != ';'))
        p++;
    }

    while(*p && ISSPACE(*p))
      p++;
    if(*p == ';')
      p++;
  } while (*p);

  if(!gotma)
    /* max-age is mandatory */
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(!expires) {
    /* remove the entry if present verbatim (without subdomain match) */
    sts = Curl_hsts(h, hostname, FALSE);
    if(sts) {
      Curl_llist_remove(&h->list, &sts->node, NULL);
      hsts_free(sts);
    }
    return CURLE_OK;
  }

  if(CURL_OFF_T_MAX - now < expires)
    /* would overflow, use maximum value */
    expires = CURL_OFF_T_MAX;
  else
    expires += now;

  /* check if it already exists */
  sts = Curl_hsts(h, hostname, FALSE);
  if(sts) {
    /* just update these fields */
    sts->expires = expires;
    sts->includeSubDomains = subdomains;
  }
  else
    return hsts_create(h, hostname, subdomains, expires);

  return CURLE_OK;
}